

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

BSDF * __thiscall
pbrt::CoatedDiffuseMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (undefined8 param_1,ulong param_2,BSDF *__return_storage_ptr__,CoatedDiffuseMaterial *this
          ,TextureEvalContext *param_5,SampledWavelengths *param_6,undefined8 *param_7)

{
  uint8_t uVar1;
  undefined2 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  undefined1 auVar5 [16];
  uintptr_t iptr;
  undefined1 auVar6 [16];
  Float __x;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar16 [56];
  undefined1 auVar9 [64];
  undefined8 uVar15;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  ulong uVar22;
  undefined1 auVar21 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar23 [16];
  SampledSpectrum SVar24;
  UniversalTextureEvaluator local_2f9;
  undefined1 local_2f8 [16];
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  Float local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  Float local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined8 local_298;
  undefined8 uStack_290;
  BxDFHandle local_288;
  uintptr_t local_280;
  uintptr_t local_278;
  uintptr_t local_270;
  uintptr_t local_268;
  uintptr_t local_260;
  uintptr_t local_258;
  uintptr_t local_250;
  SampledSpectrum local_248;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  ulong uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  ulong uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  local_250 = (this->reflectance).
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
  local_78._0_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_78._4_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_70 = *(ulong *)&(param_5->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_68._0_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_68._4_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_60._0_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_60._4_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_58 = *(undefined8 *)&(param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_50 = *(undefined8 *)&(param_5->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_48._0_4_ = param_5->dudy;
  uStack_48._4_4_ = param_5->dvdx;
  uStack_40._0_4_ = param_5->dvdy;
  uStack_40._4_4_ = param_5->faceIndex;
  local_218 = *(undefined8 *)(param_6->lambda).values;
  uStack_210 = *(undefined8 *)((param_6->lambda).values + 2);
  uStack_208 = *(undefined8 *)(param_6->pdf).values;
  uStack_200 = *(undefined8 *)((param_6->pdf).values + 2);
  auVar16 = ZEXT856(uStack_70);
  auVar21 = ZEXT856(param_2);
  SVar24 = UniversalTextureEvaluator::operator()
                     (&local_2f9,(SpectrumTextureHandle)&local_250,*param_5,*param_6);
  auVar17._0_8_ = SVar24.values.values._8_8_;
  auVar17._8_56_ = auVar21;
  auVar9._0_8_ = SVar24.values.values._0_8_;
  auVar9._8_56_ = auVar16;
  local_248.values.values = (array<float,_4>)vmovlhps_avx(auVar9._0_16_,auVar17._0_16_);
  uVar15 = local_248.values.values._8_8_;
  SVar24 = Clamp<int,int>(&local_248,0,1);
  auVar18._0_8_ = SVar24.values.values._8_8_;
  auVar18._8_56_ = auVar21;
  local_298 = SVar24.values.values._0_8_;
  local_258 = (this->uRoughness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_2a8 = auVar18._0_16_;
  local_b8._0_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_b8._4_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_b0 = *(undefined8 *)&(param_5->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_a8._0_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_a8._4_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_a0._0_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_a0._4_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_98 = *(undefined8 *)&(param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_90 = *(undefined8 *)&(param_5->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_88._0_4_ = param_5->dudy;
  uStack_88._4_4_ = param_5->dvdx;
  uStack_80._0_4_ = param_5->dvdy;
  uStack_80._4_4_ = param_5->faceIndex;
  uStack_290 = uVar15;
  __x = UniversalTextureEvaluator::operator()(&local_2f9,(FloatTextureHandle)&local_258,*param_5);
  local_260 = (this->vRoughness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_f8._0_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_f8._4_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_f0 = *(undefined8 *)&(param_5->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_e8._0_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_e8._4_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_e0._0_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_e0._4_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_d8 = *(undefined8 *)&(param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_d0 = *(undefined8 *)&(param_5->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_c8._0_4_ = param_5->dudy;
  uStack_c8._4_4_ = param_5->dvdx;
  uStack_c0._0_4_ = param_5->dvdy;
  uStack_c0._4_4_ = param_5->faceIndex;
  auVar10._0_4_ =
       UniversalTextureEvaluator::operator()(&local_2f9,(FloatTextureHandle)&local_260,*param_5);
  auVar10._4_60_ = extraout_var;
  auVar7 = auVar10._0_16_;
  if (this->remapRoughness == true) {
    if (__x < 0.0) {
      auVar11._0_4_ = sqrtf(__x);
      auVar11._4_60_ = extraout_var_00;
      auVar7 = ZEXT416((uint)auVar10._0_4_);
      auVar8 = auVar11._0_16_;
    }
    else {
      auVar8 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
    }
    if (auVar7._0_4_ < 0.0) {
      auVar12._0_4_ = sqrtf(auVar7._0_4_);
      auVar12._4_60_ = extraout_var_01;
      auVar8 = ZEXT416(auVar8._0_4_);
      auVar7 = auVar12._0_16_;
    }
    else {
      auVar7 = vsqrtss_avx(auVar7,auVar7);
    }
  }
  else {
    auVar8 = ZEXT416((uint)__x);
  }
  local_268 = (this->thickness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_2b8 = vmaxss_avx(auVar8,SUB6416(ZEXT464(0x38d1b717),0));
  auVar3 = vmaxss_avx(auVar7,SUB6416(ZEXT464(0x38d1b717),0));
  local_138._0_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_138._4_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_130 = *(undefined8 *)&(param_5->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_128._0_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_128._4_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_120._0_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_120._4_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_118 = *(undefined8 *)&(param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_110 = *(undefined8 *)&(param_5->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_108._0_4_ = param_5->dudy;
  uStack_108._4_4_ = param_5->dvdx;
  uStack_100._0_4_ = param_5->dvdy;
  uStack_100._4_4_ = param_5->faceIndex;
  local_2c8 = UniversalTextureEvaluator::operator()
                        (&local_2f9,(FloatTextureHandle)&local_268,*param_5);
  local_270 = (this->eta).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_178._0_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_178._4_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_170 = *(undefined8 *)&(param_5->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_168._0_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_168._4_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_160._0_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_160._4_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_158 = *(undefined8 *)&(param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_150 = *(undefined8 *)&(param_5->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_148._0_4_ = param_5->dudy;
  uStack_148._4_4_ = param_5->dvdx;
  uStack_140._0_4_ = param_5->dvdy;
  uStack_140._4_4_ = param_5->faceIndex;
  uVar22 = 0;
  uStack_2c4 = extraout_XMM0_Db;
  uStack_2c0 = extraout_XMM0_Dc;
  uStack_2bc = extraout_XMM0_Dd;
  local_2d8 = UniversalTextureEvaluator::operator()
                        (&local_2f9,(FloatTextureHandle)&local_270,*param_5);
  local_278 = (this->albedo).
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
  local_1b8._0_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_1b8._4_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_1b0 = *(ulong *)&(param_5->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_1a8._0_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_1a8._4_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_1a0._0_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_1a0._4_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_198 = *(undefined8 *)&(param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_190 = *(undefined8 *)&(param_5->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_188._0_4_ = param_5->dudy;
  uStack_188._4_4_ = param_5->dvdx;
  uStack_180._0_4_ = param_5->dvdy;
  uStack_180._4_4_ = param_5->faceIndex;
  local_238 = *(undefined8 *)(param_6->lambda).values;
  uStack_230 = *(undefined8 *)((param_6->lambda).values + 2);
  uStack_228 = *(undefined8 *)(param_6->pdf).values;
  uStack_220 = *(undefined8 *)((param_6->pdf).values + 2);
  auVar16 = ZEXT856(uStack_1b0);
  auVar21 = ZEXT856(uVar22);
  uStack_2d4 = extraout_XMM0_Db_00;
  uStack_2d0 = extraout_XMM0_Dc_00;
  uStack_2cc = extraout_XMM0_Dd_00;
  SVar24 = UniversalTextureEvaluator::operator()
                     (&local_2f9,(SpectrumTextureHandle)&local_278,*param_5,*param_6);
  auVar19._0_8_ = SVar24.values.values._8_8_;
  auVar19._8_56_ = auVar21;
  auVar13._0_8_ = SVar24.values.values._0_8_;
  auVar13._8_56_ = auVar16;
  local_248.values.values = (array<float,_4>)vmovlhps_avx(auVar13._0_16_,auVar19._0_16_);
  uVar15 = local_248.values.values._8_8_;
  SVar24 = Clamp<int,int>(&local_248,0,1);
  auVar20._0_8_ = SVar24.values.values._8_8_;
  auVar20._8_56_ = auVar21;
  local_2e8 = SVar24.values.values._0_8_;
  local_280 = (this->g).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_2f8 = auVar20._0_16_;
  local_1f8._0_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_1f8._4_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_1f0 = *(undefined8 *)&(param_5->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_1e8._0_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_1e8._4_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_1e0._0_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_1e0._4_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_1d8 = *(undefined8 *)&(param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_1d0 = *(undefined8 *)&(param_5->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_1c8._0_4_ = param_5->dudy;
  uStack_1c8._4_4_ = param_5->dvdx;
  uStack_1c0._0_4_ = param_5->dvdy;
  uStack_1c0._4_4_ = param_5->faceIndex;
  uStack_2e0 = uVar15;
  auVar14._0_4_ =
       UniversalTextureEvaluator::operator()(&local_2f9,(FloatTextureHandle)&local_280,*param_5);
  auVar14._4_60_ = extraout_var_02;
  auVar8._4_4_ = uStack_2d4;
  auVar8._0_4_ = local_2d8;
  auVar8._8_4_ = uStack_2d0;
  auVar8._12_4_ = uStack_2cc;
  uVar2 = *(undefined2 *)&this->config;
  uVar1 = (this->config).twoSided;
  auVar5._4_4_ = uStack_2c4;
  auVar5._0_4_ = local_2c8;
  auVar5._8_4_ = uStack_2c0;
  auVar5._12_4_ = uStack_2bc;
  auVar23._8_8_ = 0xbf80000000800000;
  auVar23._0_8_ = 0xbf80000000800000;
  local_288.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )((ulong)param_7 | 0x3000000000000);
  uVar15 = vcmpss_avx512f(auVar8,SUB6416(ZEXT464(0x3f800000),0),0);
  bVar4 = (bool)((byte)uVar15 & 1);
  auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14._0_16_);
  auVar7 = vinsertps_avx(auVar5,auVar14._0_16_,0x10);
  uVar22 = vcmpps_avx512vl(auVar7,auVar23,1);
  auVar7 = vinsertps_avx(auVar5,auVar8,0x10);
  auVar8 = vinsertps_avx(ZEXT416((uint)bVar4 * 0x3f8020c5 + (uint)!bVar4 * (int)local_2d8),
                         ZEXT416((uint)local_2b8._0_4_),0x10);
  bVar4 = (bool)((byte)uVar22 & 1);
  auVar6._0_4_ = (uint)bVar4 * 0x800000 | (uint)!bVar4 * auVar7._0_4_;
  bVar4 = (bool)((byte)(uVar22 >> 1) & 1);
  auVar6._4_4_ = (uint)bVar4 * -0x40800000 | (uint)!bVar4 * auVar7._4_4_;
  bVar4 = (bool)((byte)(uVar22 >> 2) & 1);
  auVar6._8_4_ = (uint)bVar4 * 0x800000 | (uint)!bVar4 * auVar7._8_4_;
  bVar4 = (bool)((byte)(uVar22 >> 3) & 1);
  auVar6._12_4_ = (uint)bVar4 * -0x40800000 | (uint)!bVar4 * auVar7._12_4_;
  uVar15 = vmovlps_avx(auVar8);
  *param_7 = uVar15;
  *(int *)(param_7 + 1) = auVar3._0_4_;
  auVar3._8_8_ = uStack_290;
  auVar3._0_8_ = local_298;
  auVar7 = vunpcklpd_avx(auVar3,local_2a8);
  *(undefined1 (*) [16])((long)param_7 + 0xc) = auVar7;
  uVar15 = vmovlps_avx(auVar6);
  *(undefined8 *)((long)param_7 + 0x1c) = uVar15;
  auVar7._8_8_ = uStack_2e0;
  auVar7._0_8_ = local_2e8;
  auVar7 = vunpcklpd_avx(auVar7,local_2f8);
  *(undefined1 (*) [16])((long)param_7 + 0x24) = auVar7;
  *(uint8_t *)((long)param_7 + 0x36) = uVar1;
  *(undefined2 *)((long)param_7 + 0x34) = uVar2;
  BSDF::BSDF(__return_storage_ptr__,(Vector3f *)(param_5 + 1),(Normal3f *)&param_5[1].dpdx,
             (Normal3f *)&param_5[1].dpdy,(Vector3f *)&param_5[1].uv,&local_288,1.0);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, const MaterialEvalContext &ctx,
                              SampledWavelengths &lambda, CoatedDiffuseBxDF *bxdf) const {
        // Initialize diffuse component of plastic material
        SampledSpectrum r = Clamp(texEval(reflectance, ctx, lambda), 0, 1);

        // Create microfacet distribution _distrib_ for coated diffuse material
        Float urough = texEval(uRoughness, ctx);
        Float vrough = texEval(vRoughness, ctx);
        if (remapRoughness) {
            urough = TrowbridgeReitzDistribution::RoughnessToAlpha(urough);
            vrough = TrowbridgeReitzDistribution::RoughnessToAlpha(vrough);
        }
        TrowbridgeReitzDistribution distrib(urough, vrough);

        Float thick = texEval(thickness, ctx);
        Float e = texEval(eta, ctx);
        SampledSpectrum a = Clamp(texEval(albedo, ctx, lambda), 0, 1);
        Float gg = Clamp(texEval(g, ctx), -1, 1);

        *bxdf = CoatedDiffuseBxDF(DielectricInterfaceBxDF(e, distrib),
                                  IdealDiffuseBxDF(r), thick, a, gg, config);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf);
    }